

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O1

void __thiscall Socket::Poll::Private::set(Private *this,Socket *socket,uint events)

{
  HashMap<Socket_*,_unsigned_int> *this_00;
  uint *puVar1;
  Item **ppIVar2;
  Item **ppIVar3;
  Socket *pSVar4;
  code *pcVar5;
  int iVar6;
  Iterator IVar7;
  uint uVar8;
  uint uVar9;
  HashMap<Socket_*,_Socket::Poll::Private::SocketInfo> *this_01;
  Item *pIVar10;
  Iterator it;
  epoll_event ev;
  Item *local_40;
  undefined1 local_38 [16];
  
  this_01 = &this->sockets;
  ppIVar2 = (this->sockets).data;
  if (ppIVar2 != (Item **)0x0) {
    for (pIVar10 = ppIVar2[((ulong)socket >> 3) % (this->sockets).capacity]; pIVar10 != (Item *)0x0;
        pIVar10 = pIVar10->nextCell) {
      if (pIVar10->key == socket) goto LAB_00110d4f;
    }
  }
  pIVar10 = (this_01->_end).item;
LAB_00110d4f:
  if (pIVar10 == (this_01->_end).item) {
    iVar6 = socket->s;
    if (iVar6 != -1) {
      local_38._0_4_ = 0;
      local_38._4_4_ = 0;
      local_38._8_4_ = 0;
      local_38._12_4_ = 0;
      local_40 = (Item *)socket;
      IVar7 = HashMap<Socket_*,_Socket::Poll::Private::SocketInfo>::insert
                        (this_01,&this_01->_end,(Socket **)&local_40,(SocketInfo *)local_38);
      ((IVar7.item)->value).s = iVar6;
      ((IVar7.item)->value).socket = socket;
      uVar9 = 0x2011;
      if ((events & 5) == 0) {
        uVar9 = 0;
      }
      local_38._0_4_ = uVar9 | 0x2014;
      if ((events & 10) == 0) {
        local_38._0_4_ = uVar9;
      }
      local_38._4_8_ = &(IVar7.item)->value;
      ((IVar7.item)->value).events = events;
      iVar6 = epoll_ctl(this->fd,1,iVar6,(epoll_event *)local_38);
      if (iVar6 != 0) {
        iVar6 = Debug::printf("%s:%u: verification failed: %s\n",
                              "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]dehprox/3rdparty/libnstd/src/Socket/Socket.cpp"
                              ,0x4d1,"epoll_ctl(fd, EPOLL_CTL_ADD, s, &ev) == 0");
        if (iVar6 != 0) goto LAB_00110eaf;
      }
    }
  }
  else {
    uVar9 = (pIVar10->value).events;
    if (uVar9 != events) {
      (pIVar10->value).events = events;
      uVar8 = 0x2011;
      if ((events & 5) == 0) {
        uVar8 = 0;
      }
      local_38._0_4_ = uVar8 | 0x2014;
      if ((events & 10) == 0) {
        local_38._0_4_ = uVar8;
      }
      local_38._4_8_ = &pIVar10->value;
      iVar6 = epoll_ctl(this->fd,3,socket->s,(epoll_event *)local_38);
      if (iVar6 != 0) {
        iVar6 = Debug::printf("%s:%u: verification failed: %s\n",
                              "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]dehprox/3rdparty/libnstd/src/Socket/Socket.cpp"
                              ,0x4bc,"epoll_ctl(fd, EPOLL_CTL_MOD, socket.s, &ev) == 0");
        if (iVar6 != 0) {
LAB_00110eaf:
          pcVar5 = (code *)invalidInstructionException();
          (*pcVar5)();
        }
      }
      this_00 = &this->selectedSockets;
      ppIVar3 = (this->selectedSockets).data;
      if (ppIVar3 != (Item **)0x0) {
        pSVar4 = (pIVar10->value).socket;
        for (local_40 = ppIVar3[((ulong)pSVar4 >> 3) % (this->selectedSockets).capacity];
            local_40 != (Item *)0x0; local_40 = local_40->nextCell) {
          if (local_40->key == pSVar4) goto LAB_00110eb4;
        }
      }
      local_40 = (this_00->_end).item;
LAB_00110eb4:
      if (local_40 != (this_00->_end).item) {
        puVar1 = &local_40->value;
        *puVar1 = *puVar1 & (~uVar9 | events);
        if (*puVar1 == 0) {
          HashMap<Socket_*,_unsigned_int>::remove(this_00,(char *)&local_40);
        }
      }
    }
  }
  return;
}

Assistant:

void Socket::Poll::Private::set(Socket& socket, uint events)
{
  epoll_event ev;
  HashMap<Socket*, Private::SocketInfo>::Iterator it = sockets.find(&socket);
  if(it != sockets.end())
  {
    Private::SocketInfo& sockInfo = *it;
    if(sockInfo.events == events)
      return;
    uint removedEvents = sockInfo.events & ~events;
    sockInfo.events = events;
    ev.events = mapEvents(events);
    ev.data.ptr = &sockInfo;
    VERIFY(epoll_ctl(fd, EPOLL_CTL_MOD, socket.s, &ev) == 0);
    HashMap<Socket*, uint>::Iterator it = selectedSockets.find(sockInfo.socket);
    if(it != selectedSockets.end())
    {
      uint& selectedEvents = *it;
      selectedEvents &= ~removedEvents;
      if(selectedEvents == 0)
        selectedSockets.remove(it);
    }
  }
  else
  {
    SOCKET s = socket.s;
    if(s == INVALID_SOCKET)
      return;
    Private::SocketInfo& sockInfo = sockets.append(&socket, Private::SocketInfo());
    sockInfo.s = s;
    sockInfo.socket = &socket;
    sockInfo.events = events;
    ev.events = mapEvents(events);
    ev.data.ptr = &sockInfo;
    VERIFY(epoll_ctl(fd, EPOLL_CTL_ADD, s, &ev) == 0);
  }
}